

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O1

void __thiscall
duckdb::Expression::Expression
          (Expression *this,ExpressionType type,ExpressionClass expression_class,
          LogicalType *return_type)

{
  (this->super_BaseExpression).type = type;
  (this->super_BaseExpression).expression_class = expression_class;
  (this->super_BaseExpression).alias._M_dataplus._M_p =
       (pointer)&(this->super_BaseExpression).alias.field_2;
  (this->super_BaseExpression).alias._M_string_length = 0;
  (this->super_BaseExpression).alias.field_2._M_local_buf[0] = '\0';
  (this->super_BaseExpression).query_location.index = 0xffffffffffffffff;
  (this->super_BaseExpression)._vptr_BaseExpression = (_func_int **)&PTR__Expression_019af228;
  LogicalType::LogicalType(&this->return_type,return_type);
  (this->verification_stats).
  super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl = (BaseStatistics *)0x0;
  return;
}

Assistant:

Expression::Expression(ExpressionType type, ExpressionClass expression_class, LogicalType return_type)
    : BaseExpression(type, expression_class), return_type(std::move(return_type)) {
}